

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O0

void test_archive_string_sprintf(void)

{
  char *s129;
  char *s128;
  char *s65;
  char *s64;
  char *s33;
  char *s32;
  archive_string s;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  uint in_stack_ffffffffffffffb4;
  char *v2;
  char *e1;
  char *file;
  char *pcVar2;
  wchar_t line;
  char *file_00;
  char *extra;
  char *local_18;
  void *pvVar3;
  wchar_t utf8;
  
  extra = "0123456789abcdef0123456789abcdef";
  file_00 = "0123456789abcdef0123456789abcdef0";
  pcVar2 = "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef";
  file = "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0";
  e1 = 
  "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"
  ;
  v2 = 
  "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0"
  ;
  local_18 = (char *)0x0;
  pvVar3 = (void *)0x0;
  utf8 = L'\0';
  assertion_equal_int("0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0",L'\0',
                      0x2cf939,(char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                      ,0,(char *)0x139749,"0123456789abcdef0123456789abcdef");
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0,
                      (char *)0x139779,extra);
  uVar1 = 0;
  assertion_equal_string
            (file_00,(wchar_t)((ulong)pcVar2 >> 0x20),file,e1,v2,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8);
  archive_string_sprintf((archive_string *)&local_18,"%s","");
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x1397fd,extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139830,extra);
  uVar1 = 0;
  assertion_equal_string
            (file_00,(wchar_t)((ulong)pcVar2 >> 0x20),file,e1,v2,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8);
  pvVar3 = (void *)0x0;
  archive_string_sprintf((archive_string *)&local_18,"%s",extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x1398c3,extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x1398f6,extra);
  uVar1 = 0;
  assertion_equal_string
            (file_00,(wchar_t)((ulong)pcVar2 >> 0x20),file,e1,v2,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8);
  pvVar3 = (void *)0x0;
  archive_string_sprintf((archive_string *)&local_18,"%s",file_00);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139987,extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x1399ba,extra);
  uVar1 = 0;
  assertion_equal_string
            (file_00,(wchar_t)((ulong)pcVar2 >> 0x20),file,e1,v2,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8);
  pvVar3 = (void *)0x0;
  archive_string_sprintf((archive_string *)&local_18,"%s",pcVar2);
  line = (wchar_t)((ulong)pcVar2 >> 0x20);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139a4b,extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139a7e,extra);
  uVar1 = 0;
  assertion_equal_string
            (file_00,line,file,e1,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8)
  ;
  pvVar3 = (void *)0x0;
  archive_string_sprintf((archive_string *)&local_18,"%s",file);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139b0f,extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139b42,extra);
  uVar1 = 0;
  assertion_equal_string
            (file_00,line,file,e1,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8)
  ;
  pvVar3 = (void *)0x0;
  archive_string_sprintf((archive_string *)&local_18,"%s",e1);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139bd3,extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139c06,extra);
  uVar1 = 0;
  assertion_equal_string
            (file_00,line,file,e1,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8)
  ;
  pvVar3 = (void *)0x0;
  archive_string_sprintf((archive_string *)&local_18,"%s",v2);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139c97,extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139cca,extra);
  uVar1 = 0;
  assertion_equal_string
            (file_00,line,file,e1,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8)
  ;
  pvVar3 = (void *)0x0;
  archive_string_sprintf((archive_string *)&local_18,"%d",0x499602d2);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139d5b,extra);
  assertion_equal_int(file,(wchar_t)((ulong)e1 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar1),0,(char *)0x139d8e,extra);
  assertion_equal_string
            (file_00,line,file,e1,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),pvVar3,utf8)
  ;
  return;
}

Assistant:

static void
test_archive_string_sprintf(void)
{
	struct archive_string s;
#define S16 "0123456789abcdef"
#define S32 S16 S16
#define S64 S32 S32
#define S128 S64 S64
	const char *s32 = S32;
	const char *s33 = S32 "0";
	const char *s64 = S64;
	const char *s65 = S64 "0";
	const char *s128 = S128;
	const char *s129 = S128 "0";
#undef S16
#undef S32
#undef S64
#undef S128

	archive_string_init(&s);
	assertExactString(0, 0, NULL, s);

	archive_string_sprintf(&s, "%s", "");
	assertExactString(0, 2 * EXTENT, "", s);

	archive_string_empty(&s);
	archive_string_sprintf(&s, "%s", s32);
	assertExactString(32, 2 * EXTENT, s32, s);

	archive_string_empty(&s);
	archive_string_sprintf(&s, "%s", s33);
	assertExactString(33, 2 * EXTENT, s33, s);

	archive_string_empty(&s);
	archive_string_sprintf(&s, "%s", s64);
	assertExactString(64, 4 * EXTENT, s64, s);

	archive_string_empty(&s);
	archive_string_sprintf(&s, "%s", s65);
	assertExactString(65, 4 * EXTENT, s65, s);

	archive_string_empty(&s);
	archive_string_sprintf(&s, "%s", s128);
	assertExactString(128, 8 * EXTENT, s128, s);

	archive_string_empty(&s);
	archive_string_sprintf(&s, "%s", s129);
	assertExactString(129, 8 * EXTENT, s129, s);

	archive_string_empty(&s);
	archive_string_sprintf(&s, "%d", 1234567890);
	assertExactString(10, 8 * EXTENT, "1234567890", s);
}